

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrSessionBeginDebugUtilsLabelRegionEXT
                   (XrSession session,XrDebugUtilsLabelEXT *labelInfo)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_3e1;
  string local_3e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c0;
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_308;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_278 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  XrSession_T local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_44;
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrDebugUtilsLabelEXT *labelInfo_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  labelInfo_local = (XrDebugUtilsLabelEXT *)session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  local_44 = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_40
             ,(XrSession_T **)&labelInfo_local,&local_44);
  VVar1 = VerifyXrSessionHandle((XrSession *)&labelInfo_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo
                      (&g_session_info,(XrSession_T *)labelInfo_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2a0 = pGVar2;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (labelInfo == (XrDebugUtilsLabelEXT *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c0,"VUID-xrSessionBeginDebugUtilsLabelRegionEXT-labelInfo-parameter",
                 &local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"xrSessionBeginDebugUtilsLabelRegionEXT",&local_2e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_308,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,
                 "Invalid NULL for XrDebugUtilsLabelEXT \"labelInfo\" which is not optional and must be non-NULL"
                 ,&local_329);
      CoreValidLogMessage(pGVar2,(string *)local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2e8,&local_308,(string *)local_328);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_308);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,"xrSessionBeginDebugUtilsLabelRegionEXT",&local_351);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_350,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_40,true,true,labelInfo);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      pGVar2 = local_2a0;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_378,"VUID-xrSessionBeginDebugUtilsLabelRegionEXT-labelInfo-parameter",
                   &local_379);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a0,"xrSessionBeginDebugUtilsLabelRegionEXT",&local_3a1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3c0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3e0,
                   "Command xrSessionBeginDebugUtilsLabelRegionEXT param labelInfo is invalid",
                   &local_3e1);
        CoreValidLogMessage(pGVar2,(string *)local_378,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3a0,&local_3c0,(string *)local_3e0);
        std::__cxx11::string::~string(local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3c0);
        std::__cxx11::string::~string(local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        std::__cxx11::string::~string(local_378);
        std::allocator<char>::~allocator((allocator<char> *)&local_379);
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_1f0);
    std::operator<<((ostream *)local_1d0,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"VUID-xrSessionBeginDebugUtilsLabelRegionEXT-session-parameter",&local_211)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"xrSessionBeginDebugUtilsLabelRegionEXT",&local_239);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_258,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_210,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_238,&local_258,local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_258);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrSessionBeginDebugUtilsLabelRegionEXT(
XrSession session,
const XrDebugUtilsLabelEXT* labelInfo) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrSessionBeginDebugUtilsLabelRegionEXT-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSessionBeginDebugUtilsLabelRegionEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == labelInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSessionBeginDebugUtilsLabelRegionEXT-labelInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSessionBeginDebugUtilsLabelRegionEXT", objects_info,
                                "Invalid NULL for XrDebugUtilsLabelEXT \"labelInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrDebugUtilsLabelEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrSessionBeginDebugUtilsLabelRegionEXT", objects_info,
                                                        true, true, labelInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSessionBeginDebugUtilsLabelRegionEXT-labelInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSessionBeginDebugUtilsLabelRegionEXT",
                                objects_info,
                                "Command xrSessionBeginDebugUtilsLabelRegionEXT param labelInfo is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}